

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O0

int proxy_client_recv(proxy_client_handle *ch,proxy_msg *msg,uint8_t *buff,size_t buff_len)

{
  conn_handle *conn;
  int local_3c;
  int ret;
  proxy_client_priv *priv;
  size_t buff_len_local;
  uint8_t *buff_local;
  proxy_msg *msg_local;
  proxy_client_handle *ch_local;
  
  conn = (conn_handle *)ch->priv;
  local_3c = conn_recv(conn,&msg->type,9);
  if ((-1 < local_3c) && (msg->size != 0)) {
    if (buff_len < msg->size) {
      return -0x1c;
    }
    local_3c = conn_recv(conn,buff,(ulong)msg->size);
  }
  return local_3c;
}

Assistant:

int proxy_client_recv(struct proxy_client_handle *ch, struct proxy_msg *msg,
                      uint8_t *buff, size_t buff_len)
{
	struct proxy_client_priv *priv = ch->priv;
	int ret;

	ret = conn_recv(&priv->conn, (uint8_t *)msg, sizeof(*msg));
	if (ret >= 0 && msg->size > 0) {
		if (msg->size > buff_len)
			return -ENOSPC;
		ret = conn_recv(&priv->conn, buff, msg->size);
	}

	return ret;
}